

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit_p.cpp
# Opt level: O0

void __thiscall QLineEditPrivate::positionSideWidgets(QLineEditPrivate *this)

{
  bool bVar1;
  int iVar2;
  QWidget *this_00;
  ulong uVar3;
  QLineEditPrivate *in_RDI;
  long in_FS_OFFSET;
  SideWidgetEntry *e_1;
  SideWidgetEntryList *__range2_1;
  SideWidgetEntry *e;
  SideWidgetEntryList *__range2;
  int delta;
  QLineEdit *q;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  const_iterator __end2;
  const_iterator __begin2;
  QRect widgetGeometry;
  SideWidgetParameters p;
  QRect contentRect;
  int in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  int iVar4;
  QSize *in_stack_ffffffffffffff60;
  QLineEditPrivate *in_stack_ffffffffffffff68;
  QRect *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff80;
  __normal_iterator<const_QLineEditPrivate::SideWidgetEntry_*,_std::vector<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>_>
  local_60;
  SideWidgetEntry *local_58;
  __normal_iterator<const_QLineEditPrivate::SideWidgetEntry_*,_std::vector<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>_>
  local_50 [3];
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 local_28 [12];
  int iStack_1c;
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &q_func(in_RDI)->super_QWidget;
  bVar1 = hasSideWidgets((QLineEditPrivate *)
                         CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  if (bVar1) {
    local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = (undefined1  [16])QWidget::rect((QWidget *)in_stack_ffffffffffffff68);
    stack0xffffffffffffffe0 = &DAT_aaaaaaaaaaaaaaaa;
    local_28._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    _local_28 = sideWidgetParameters(in_stack_ffffffffffffff68);
    iVar2 = iStack_1c + local_28._4_4_;
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    local_30 = &DAT_aaaaaaaaaaaaaaaa;
    iVar4 = iStack_1c;
    QRect::height((QRect *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    QPoint::QPoint((QPoint *)CONCAT44(iVar4,in_stack_ffffffffffffff50),in_stack_ffffffffffffff4c,
                   in_stack_ffffffffffffff48);
    QSize::QSize((QSize *)CONCAT44(iVar4,in_stack_ffffffffffffff50),in_stack_ffffffffffffff4c,
                 in_stack_ffffffffffffff48);
    QRect::QRect(in_stack_ffffffffffffff70,(QPoint *)in_stack_ffffffffffffff68,
                 in_stack_ffffffffffffff60);
    leftSideWidgetList((QLineEditPrivate *)CONCAT44(iVar4,in_stack_ffffffffffffff50));
    local_50[0]._M_current = (SideWidgetEntry *)&DAT_aaaaaaaaaaaaaaaa;
    local_50[0]._M_current =
         (SideWidgetEntry *)
         std::
         vector<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
         ::begin((vector<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
                  *)CONCAT44(iVar4,in_stack_ffffffffffffff50));
    local_58 = (SideWidgetEntry *)&DAT_aaaaaaaaaaaaaaaa;
    local_58 = (SideWidgetEntry *)
               std::
               vector<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
               ::end((vector<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
                      *)CONCAT44(iVar4,in_stack_ffffffffffffff50));
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_QLineEditPrivate::SideWidgetEntry_*,_std::vector<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>_>
                               *)CONCAT44(iVar4,in_stack_ffffffffffffff50),
                              (__normal_iterator<const_QLineEditPrivate::SideWidgetEntry_*,_std::vector<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>_>
                               *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48)),
          bVar1) {
      __gnu_cxx::
      __normal_iterator<const_QLineEditPrivate::SideWidgetEntry_*,_std::vector<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>_>
      ::operator*(local_50);
      QWidget::setGeometry(this_00,(QRect *)CONCAT44(iVar2,in_stack_ffffffffffffff80));
      uVar3 = QAction::isVisible();
      if ((uVar3 & 1) != 0) {
        QRect::left((QRect *)0x5d35eb);
        QRect::moveLeft((QRect *)CONCAT44(iVar4,in_stack_ffffffffffffff50),in_stack_ffffffffffffff4c
                       );
      }
      __gnu_cxx::
      __normal_iterator<const_QLineEditPrivate::SideWidgetEntry_*,_std::vector<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>_>
      ::operator++(local_50);
    }
    QRect::width((QRect *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    QRect::moveLeft((QRect *)CONCAT44(iVar4,in_stack_ffffffffffffff50),in_stack_ffffffffffffff4c);
    rightSideWidgetList((QLineEditPrivate *)CONCAT44(iVar4,in_stack_ffffffffffffff50));
    local_60._M_current = (SideWidgetEntry *)&DAT_aaaaaaaaaaaaaaaa;
    local_60._M_current =
         (SideWidgetEntry *)
         std::
         vector<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
         ::begin((vector<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
                  *)CONCAT44(iVar4,in_stack_ffffffffffffff50));
    std::
    vector<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>::
    end((vector<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
         *)CONCAT44(iVar4,in_stack_ffffffffffffff50));
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_QLineEditPrivate::SideWidgetEntry_*,_std::vector<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>_>
                               *)CONCAT44(iVar4,in_stack_ffffffffffffff50),
                              (__normal_iterator<const_QLineEditPrivate::SideWidgetEntry_*,_std::vector<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>_>
                               *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48)),
          bVar1) {
      __gnu_cxx::
      __normal_iterator<const_QLineEditPrivate::SideWidgetEntry_*,_std::vector<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>_>
      ::operator*(&local_60);
      QWidget::setGeometry(this_00,(QRect *)CONCAT44(iVar2,in_stack_ffffffffffffff80));
      uVar3 = QAction::isVisible();
      if ((uVar3 & 1) != 0) {
        QRect::left((QRect *)0x5d36f6);
        QRect::moveLeft((QRect *)CONCAT44(iVar4,in_stack_ffffffffffffff50),in_stack_ffffffffffffff4c
                       );
      }
      __gnu_cxx::
      __normal_iterator<const_QLineEditPrivate::SideWidgetEntry_*,_std::vector<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>_>
      ::operator++(&local_60);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QLineEditPrivate::positionSideWidgets()
{
    Q_Q(QLineEdit);
    if (hasSideWidgets()) {
        const QRect contentRect = q->rect();
        const SideWidgetParameters p = sideWidgetParameters();
        const int delta = p.margin + p.widgetWidth;
        QRect widgetGeometry(QPoint(p.margin, (contentRect.height() - p.widgetHeight) / 2),
                             QSize(p.widgetWidth, p.widgetHeight));
        for (const SideWidgetEntry &e : leftSideWidgetList()) {
            e.widget->setGeometry(widgetGeometry);
#if QT_CONFIG(action)
            if (e.action->isVisible())
                widgetGeometry.moveLeft(widgetGeometry.left() + delta);
#else
            Q_UNUSED(delta);
#endif
        }
        widgetGeometry.moveLeft(contentRect.width() - p.widgetWidth - p.margin);
        for (const SideWidgetEntry &e : rightSideWidgetList()) {
            e.widget->setGeometry(widgetGeometry);
#if QT_CONFIG(action)
            if (e.action->isVisible())
                widgetGeometry.moveLeft(widgetGeometry.left() - delta);
#endif
        }
    }
}